

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O2

int __thiscall
wallet::CCrypter::BytesToKeySHA512AES
          (CCrypter *this,span<const_unsigned_char,_18446744073709551615UL> salt,
          SecureString *key_data,int count,uchar *key,uchar *iv)

{
  long lVar1;
  CSHA512 *pCVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  CSHA512 di;
  uchar buf [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  if (iv != (uchar *)0x0 && (key != (uchar *)0x0 && count != 0)) {
    CSHA512::CSHA512(&di);
    CSHA512::Write(&di,(uchar *)(key_data->_M_dataplus)._M_p,key_data->_M_string_length);
    CSHA512::Write(&di,salt._M_ptr,salt._M_extent._M_extent_value._M_extent_value);
    CSHA512::Finalize(&di,buf);
    iVar3 = count + -1;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      pCVar2 = CSHA512::Reset(&di);
      pCVar2 = CSHA512::Write(pCVar2,buf,0x40);
      CSHA512::Finalize(pCVar2,buf);
    }
    *(undefined8 *)(key + 0x10) = buf._16_8_;
    *(undefined8 *)(key + 0x18) = buf._24_8_;
    *(undefined8 *)key = buf._0_8_;
    *(undefined8 *)(key + 8) = buf._8_8_;
    *(undefined8 *)iv = buf._32_8_;
    *(undefined8 *)(iv + 8) = buf._40_8_;
    memory_cleanse(buf,0x40);
    iVar3 = 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int CCrypter::BytesToKeySHA512AES(const std::span<const unsigned char> salt, const SecureString& key_data, int count, unsigned char* key, unsigned char* iv) const
{
    // This mimics the behavior of openssl's EVP_BytesToKey with an aes256cbc
    // cipher and sha512 message digest. Because sha512's output size (64b) is
    // greater than the aes256 block size (16b) + aes256 key size (32b),
    // there's no need to process more than once (D_0).

    if(!count || !key || !iv)
        return 0;

    unsigned char buf[CSHA512::OUTPUT_SIZE];
    CSHA512 di;

    di.Write(UCharCast(key_data.data()), key_data.size());
    di.Write(salt.data(), salt.size());
    di.Finalize(buf);

    for(int i = 0; i != count - 1; i++)
        di.Reset().Write(buf, sizeof(buf)).Finalize(buf);

    memcpy(key, buf, WALLET_CRYPTO_KEY_SIZE);
    memcpy(iv, buf + WALLET_CRYPTO_KEY_SIZE, WALLET_CRYPTO_IV_SIZE);
    memory_cleanse(buf, sizeof(buf));
    return WALLET_CRYPTO_KEY_SIZE;
}